

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

Float __thiscall pbrt::Disk::PDF(Disk *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  Point3f PVar12;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_148;
  char local_48;
  Ray local_40;
  
  auVar10 = in_ZMM0._8_56_;
  PVar12 = ShapeSampleContext::OffsetRayOrigin(ctx,wi);
  local_40.o.super_Tuple3<pbrt::Point3,_float>.z = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  local_40.time = ctx->time;
  local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9._0_16_);
  local_40.d.super_Tuple3<pbrt::Vector3,_float>.z = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
  local_40.d.super_Tuple3<pbrt::Vector3,_float>.x = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
  local_40.d.super_Tuple3<pbrt::Vector3,_float>.y = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
  local_40.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  Intersect((optional<pbrt::ShapeIntersection> *)&local_148.__align,this,&local_40,INFINITY);
  if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
     (iVar3 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::
                                   reg), iVar3 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)
               &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
               const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x270) = *(long *)(in_FS_OFFSET + -0x270) + 1;
  if (local_48 == '\0') {
    *(long *)(in_FS_OFFSET + -0x278) = *(long *)(in_FS_OFFSET + -0x278) + 1;
    FVar7 = 0.0;
  }
  else {
    uVar1 = this->radius;
    uVar2 = this->innerRadius;
    auVar11._0_4_ = (float)uVar1 * (float)uVar1;
    auVar11._4_4_ = (float)uVar2 * (float)uVar2;
    auVar11._8_8_ = 0;
    auVar11 = vhsubps_avx(auVar11,auVar11);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar5 = ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).z);
    auVar4 = vxorps_avx512vl(auVar5,auVar4);
    auVar8 = ZEXT416((uint)((float)local_148._48_4_ * auVar4._0_4_));
    auVar4 = vfnmadd132ss_fma(ZEXT416((uint)local_148._44_4_),auVar8,
                              ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).y));
    auVar5 = vfnmsub213ss_fma(auVar5,ZEXT416((uint)local_148._48_4_),auVar8);
    auVar4 = vfnmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar5._0_4_)),
                              ZEXT416((uint)local_148._40_4_),
                              ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).x));
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(auVar4,auVar5);
    fVar6 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low +
            (ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high) * 0.5 -
            ((float)local_148._8_4_ + (float)local_148._12_4_) * 0.5;
    auVar4 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
                            (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5 -
                           ((float)local_148._0_4_ + (float)local_148._4_4_) * 0.5));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar4,auVar4);
    auVar8 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                            (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
                           ((float)local_148._16_4_ + (float)local_148._20_4_) * 0.5));
    auVar4 = vfmadd231ss_fma(auVar4,auVar8,auVar8);
    fVar6 = (1.0 / (this->phiMax * 0.5 * auVar11._0_4_)) / (auVar5._0_4_ / auVar4._0_4_);
    FVar7 = (Float)((uint)(ABS(fVar6) != INFINITY) * (int)fVar6);
  }
  return FVar7;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
        // Intersect sample ray with shape geometry
        Ray ray = ctx.SpawnRay(wi);
        pstd::optional<ShapeIntersection> isect = Intersect(ray);
        CHECK_RARE(1e-6, !isect.has_value());
        if (!isect)
            return 0;

        // Compute PDF in solid angle measure from shape intersection point
        Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                    DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;

        return pdf;
    }